

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O3

int inflateBackEnd(z_streamp strm)

{
  int iVar1;
  
  iVar1 = -2;
  if (((strm != (z_streamp)0x0) && (iVar1 = -2, strm->state != (internal_state *)0x0)) &&
     (strm->zfree != (free_func)0x0)) {
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateBackEnd(strm)
z_streamp strm;
{
    if (strm == Z_NULL || strm->state == Z_NULL || strm->zfree == (free_func)0)
        return Z_STREAM_ERROR;
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}